

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O2

void test_comments_7(void)

{
  run("standalone tags should not require a newline to follow them",
      "!\n  {{! I\'m Still Standalone }}","{}",(char *)0x0,"!\n");
  return;
}

Assistant:

static void
test_comments_7(void)
{
    run(
        "standalone tags should not require a newline to follow them",
        "!\n  {{! I'm Still Standalone }}",
        "{}",
        NULL,
        "!\n"
    );
}